

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::addActionMessage(BrokerBase *this,ActionMessage *message)

{
  atomic<bool> *paVar1;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *this_00;
  bool bVar2;
  unique_lock<std::mutex> uStack_38;
  unique_lock<std::mutex> uStack_28;
  
  uStack_38._M_device = (mutex_type *)&this->actionQueue;
  if (cmd_broker_setup < message->messageAction) {
    uStack_38._M_owns = false;
    std::unique_lock<std::mutex>::lock(&uStack_38);
    uStack_38._M_owns = true;
    this_00 = &(this->actionQueue).pushElements;
    if ((this->actionQueue).pushElements.
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->actionQueue).pushElements.
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &(this->actionQueue).queueEmptyFlag;
      LOCK();
      bVar2 = (paVar1->_M_base)._M_i == true;
      if (bVar2) {
        (paVar1->_M_base)._M_i = false;
      }
      UNLOCK();
      if (bVar2) {
        std::unique_lock<std::mutex>::unlock(&uStack_38);
        uStack_28._M_device = (mutex_type *)&(this->actionQueue).m_pullLock;
        uStack_28._M_owns = false;
        std::unique_lock<std::mutex>::lock(&uStack_28);
        uStack_28._M_owns = true;
        LOCK();
        (this->actionQueue).queueEmptyFlag._M_base._M_i = false;
        UNLOCK();
        if ((this->actionQueue).pullElements.
            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->actionQueue).pullElements.
            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = &(this->actionQueue).pullElements;
        }
        else {
          std::unique_lock<std::mutex>::lock(&uStack_38);
        }
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                   message);
        std::condition_variable::notify_all();
        std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                   message);
        paVar1 = &(this->actionQueue).queueEmptyFlag;
        LOCK();
        bVar2 = (paVar1->_M_base)._M_i == true;
        if (bVar2) {
          (paVar1->_M_base)._M_i = false;
        }
        UNLOCK();
        if (bVar2) {
          std::condition_variable::notify_all();
        }
      }
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
      emplace_back<helics::ActionMessage>
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 message);
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
    return;
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  emplacePriority<helics::ActionMessage>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             uStack_38._M_device,message);
  return;
}

Assistant:

void BrokerBase::addActionMessage(ActionMessage&& message) const
{
    // the queue is thread safe so can be run in a const situation without possibility of issues
    auto& lQueue = const_cast<decltype(actionQueue)&>(actionQueue);
    if (isPriorityCommand(message)) {
        lQueue.emplacePriority(std::move(message));
    } else {
        // just route to the general queue;
        lQueue.emplace(std::move(message));
    }
}